

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void newItem(string *path)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  string *local_da8;
  string *local_d48;
  string local_d40 [36];
  int local_d1c;
  string local_d18 [4];
  int i;
  int local_cf8;
  undefined4 local_cf4;
  int id;
  int local_cd0;
  int exist_layers;
  string local_cc0 [36];
  int local_c9c;
  string local_c98 [4];
  int layers;
  string asStack_18 [8];
  string *local_10;
  string *path_local;
  
  local_d48 = local_c98;
  local_10 = path;
  do {
    std::__cxx11::string::string(local_d48);
    local_d48 = local_d48 + 0x20;
  } while (local_d48 != asStack_18);
  std::__cxx11::string::string(local_cc0,(string *)path);
  iVar1 = parsePath((string *)local_cc0,(string *)local_c98);
  std::__cxx11::string::~string(local_cc0);
  local_c9c = iVar1;
  std::__cxx11::string::string((string *)&id,(string *)path);
  iVar2 = getPathType((string *)&id);
  local_cd0 = doesExist((string *)local_c98,iVar1,iVar2 == 2);
  std::__cxx11::string::~string((string *)&id);
  iVar1 = local_cd0;
  if (local_cd0 == local_c9c) {
    setColor(3);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)path);
    std::operator<<(poVar3," already exists.\n");
    setColor(2);
    local_cf4 = 1;
  }
  else {
    std::__cxx11::string::string(local_d18,(string *)path);
    iVar2 = getPathType((string *)local_d18);
    iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
    std::__cxx11::string::~string(local_d18);
    local_cf8 = iVar1;
    for (local_d1c = local_cd0; iVar1 = local_cf8, local_d1c < local_c9c; local_d1c = local_d1c + 1)
    {
      std::__cxx11::string::string(local_d40,local_c98 + (long)local_d1c * 0x20);
      local_cf8 = makeDirectoryById(iVar1,(string *)local_d40);
      std::__cxx11::string::~string(local_d40);
    }
    local_cf4 = 0;
  }
  local_da8 = asStack_18;
  do {
    local_da8 = local_da8 + -0x20;
    std::__cxx11::string::~string(local_da8);
  } while (local_da8 != local_c98);
  return;
}

Assistant:

void newItem(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int exist_layers;
    exist_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (exist_layers == layers)//执行mkdir却发现已经存在
    {
        setColor(COLOR_ERR);
        cout << path << " already exists.\n";
        setColor(COLOR_ORIGIN);
        return;
    }
    int id = getId(names, exist_layers, getPathType(path) == RELATIVE_PATH);
    for (int i = exist_layers; i < layers; i++) {
        id = makeDirectoryById(id, names[i]);
    }
}